

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O3

ON_wString __thiscall ON_wString::ToMemorySize(ON_wString *this,size_t size_in_bytes)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  
  if (size_in_bytes == 0) {
    pwVar1 = L"0 bytes";
LAB_005bf077:
    ON_wString(this,pwVar1);
  }
  else {
    if (size_in_bytes >> 0x32 == 0) {
      if (size_in_bytes >> 0x28 == 0) {
        if (size_in_bytes < 0x40000000) {
          if (size_in_bytes < 0x100000) {
            if (size_in_bytes < 0x400) {
              if (size_in_bytes != 1) {
                FormatToString((wchar_t *)this,L"%u bytes");
                return (ON_wString)(wchar_t *)this;
              }
              pwVar1 = L"1 byte";
              goto LAB_005bf077;
            }
            pwVar1 = L"KB";
          }
          else {
            size_in_bytes = size_in_bytes >> 10;
            pwVar1 = L"MB";
          }
        }
        else {
          size_in_bytes = size_in_bytes >> 0x14;
          pwVar1 = L"GB";
        }
      }
      else {
        size_in_bytes = size_in_bytes >> 0x1e;
        pwVar1 = L"TB";
      }
    }
    else {
      size_in_bytes = size_in_bytes >> 0x28;
      pwVar1 = L"PB";
    }
    if (size_in_bytes < 0x19000 && (size_in_bytes & 0x3ff) != 0) {
      if (size_in_bytes < 0x2800) {
        pwVar2 = L"%0.2f %ls";
      }
      else {
        pwVar2 = L"%0.1f %ls";
      }
      FormatToString((wchar_t *)this,(double)(long)size_in_bytes * 0.0009765625,pwVar2,pwVar1);
    }
    else {
      FormatToString((wchar_t *)this,L"%u %ls",size_in_bytes >> 10);
    }
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::ToMemorySize(size_t size_in_bytes)
{
  if (size_in_bytes <= 0)
    return ON_wString(L"0 bytes");

  ON__UINT64 sz = (ON__UINT64)size_in_bytes;

  const wchar_t* units;
  const ON__UINT64 kb = 1024;
  const ON__UINT64 mb = kb * kb;
  const ON__UINT64 gb = kb * mb;
  const ON__UINT64 tb = kb * gb;
  const ON__UINT64 pb = kb * tb;
  if (sz >= pb)
  {
    // petabytes
    sz /= tb;
    units = L"PB";
  }
  else if (sz >= tb)
  {
    // terabytes
    sz /= gb;
    units = L"TB";
  }
  else if (sz >= gb)
  {
    // gigabytes
    sz /= mb;
    units = L"GB";
  }
  else if (sz >= mb)
  {
    // megaabytes
    sz /= kb;
    units = L"MB";
  }
  else if (sz >= kb)
  {
    // kilobytes
    units = L"KB";
  }
  else
  {
    // bytes
    return  (1==sz) ? ON_wString(L"1 byte") : ON_wString::FormatToString(L"%u bytes",(unsigned)sz);
  }

  const ON__UINT64 n = sz / kb;
  const ON__UINT64 r = sz % kb;
  if (r > 0 && n < 100)
  {
    const double x = ((double)sz)/((double)kb);
    if (0 == n)
      return ON_wString::FormatToString(L"%0.03f %ls", x, units);

    if (n >= 10)
      return ON_wString::FormatToString(L"%0.1f %ls", x, units);

    return ON_wString::FormatToString(L"%0.2f %ls", x, units);
  }

  return ON_wString::FormatToString(L"%u %ls", ((unsigned)n), units);
}